

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O0

XXH128_hash_t XXH3_len_9to16_128b(xxh_u8 *input,size_t len,xxh_u8 *secret,XXH64_hash_t seed)

{
  xxh_u64 xVar1;
  xxh_u64 xVar2;
  xxh_u64 xVar3;
  xxh_u64 xVar4;
  xxh_u64 xVar5;
  xxh_u64 xVar6;
  ulong uVar7;
  XXH64_hash_t XVar8;
  XXH64_hash_t XVar9;
  long in_RCX;
  int in_ESI;
  XXH128_hash_t XVar10;
  XXH128_hash_t m128;
  xxh_u64 input_hi;
  xxh_u64 input_lo;
  xxh_u64 bitfliph;
  xxh_u64 bitflipl;
  XXH128_hash_t h128;
  undefined8 local_60;
  undefined8 local_58;
  undefined1 local_10 [16];
  
  xVar1 = XXH_readLE64((void *)0x1402b6);
  xVar2 = XXH_readLE64((void *)0x1402c8);
  xVar3 = XXH_readLE64((void *)0x1402ed);
  xVar4 = XXH_readLE64((void *)0x140300);
  xVar5 = XXH_readLE64((void *)0x140322);
  xVar6 = XXH_readLE64((void *)0x14033b);
  XVar10 = XXH_mult64to128(xVar5 ^ xVar6 ^ (xVar1 ^ xVar2) - in_RCX,0x9e3779b185ebca87);
  local_60 = XVar10.low64;
  local_58 = XVar10.high64;
  uVar7 = xVar6 ^ (xVar3 ^ xVar4) + in_RCX;
  xVar1 = XXH_swap64(local_58 + uVar7 + (uVar7 & 0xffffffff) * 0x85ebca76);
  XXH_mult64to128(local_60 + ((ulong)(in_ESI - 1) << 0x36) ^ xVar1,0xc2b2ae3d27d4eb4f);
  XVar8 = XXH3_avalanche(0x140420);
  XVar9 = XXH3_avalanche(0x14042f);
  XVar10.low64 = XVar8;
  XVar10.high64 = XVar9;
  return XVar10;
}

Assistant:

XXH_FORCE_INLINE XXH128_hash_t XXH3_len_9to16_128b(const xxh_u8* input,
                                                   size_t len,
                                                   const xxh_u8* secret,
                                                   XXH64_hash_t seed) {
  XXH_ASSERT(input != NULL);
  XXH_ASSERT(secret != NULL);
  XXH_ASSERT(9 <= len && len <= 16);
  {
    xxh_u64 const bitflipl =
        (XXH_readLE64(secret + 32) ^ XXH_readLE64(secret + 40)) - seed;
    xxh_u64 const bitfliph =
        (XXH_readLE64(secret + 48) ^ XXH_readLE64(secret + 56)) + seed;
    xxh_u64 const input_lo = XXH_readLE64(input);
    xxh_u64 input_hi = XXH_readLE64(input + len - 8);
    XXH128_hash_t m128 =
        XXH_mult64to128(input_lo ^ input_hi ^ bitflipl, XXH_PRIME64_1);
    /*
     * Put len in the middle of m128 to ensure that the length gets mixed to
     * both the low and high bits in the 128x64 multiply below.
     */
    m128.low64 += (xxh_u64)(len - 1) << 54;
    input_hi ^= bitfliph;
    /*
     * Add the high 32 bits of input_hi to the high 32 bits of m128, then
     * add the long product of the low 32 bits of input_hi and XXH_PRIME32_2 to
     * the high 64 bits of m128.
     *
     * The best approach to this operation is different on 32-bit and 64-bit.
     */
    if (sizeof(void*) < sizeof(xxh_u64)) { /* 32-bit */
      /*
       * 32-bit optimized version, which is more readable.
       *
       * On 32-bit, it removes an ADC and delays a dependency between the two
       * halves of m128.high64, but it generates an extra mask on 64-bit.
       */
      m128.high64 += (input_hi & 0xFFFFFFFF00000000ULL) +
                     XXH_mult32to64((xxh_u32)input_hi, XXH_PRIME32_2);
    } else {
      /*
       * 64-bit optimized (albeit more confusing) version.
       *
       * Uses some properties of addition and multiplication to remove the mask:
       *
       * Let:
       *    a = input_hi.lo = (input_hi & 0x00000000FFFFFFFF)
       *    b = input_hi.hi = (input_hi & 0xFFFFFFFF00000000)
       *    c = XXH_PRIME32_2
       *
       *    a + (b * c)
       * Inverse Property: x + y - x == y
       *    a + (b * (1 + c - 1))
       * Distributive Property: x * (y + z) == (x * y) + (x * z)
       *    a + (b * 1) + (b * (c - 1))
       * Identity Property: x * 1 == x
       *    a + b + (b * (c - 1))
       *
       * Substitute a, b, and c:
       *    input_hi.hi + input_hi.lo + ((xxh_u64)input_hi.lo * (XXH_PRIME32_2 -
       * 1))
       *
       * Since input_hi.hi + input_hi.lo == input_hi, we get this:
       *    input_hi + ((xxh_u64)input_hi.lo * (XXH_PRIME32_2 - 1))
       */
      m128.high64 +=
          input_hi + XXH_mult32to64((xxh_u32)input_hi, XXH_PRIME32_2 - 1);
    }
    /* m128 ^= XXH_swap64(m128 >> 64); */
    m128.low64 ^= XXH_swap64(m128.high64);

    { /* 128x64 multiply: h128 = m128 * XXH_PRIME64_2; */
      XXH128_hash_t h128 = XXH_mult64to128(m128.low64, XXH_PRIME64_2);
      h128.high64 += m128.high64 * XXH_PRIME64_2;

      h128.low64 = XXH3_avalanche(h128.low64);
      h128.high64 = XXH3_avalanche(h128.high64);
      return h128;
    }
  }
}